

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubtreeWrapper.cpp
# Opt level: O3

unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> __thiscall
IRT::CExpressionWrapper::ToConditional
          (CExpressionWrapper *this,CLabel *labelTrue,CLabel *labelFalse)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  CJumpConditionalStatement *this_00;
  CConstExpression *this_01;
  CLabelStatement *pCVar4;
  long *in_RCX;
  _Head_base<0UL,_const_IRT::CLabelStatement_*,_false> local_90;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_88;
  _Head_base<0UL,_const_IRT::CLabelStatement_*,_false> local_80;
  __uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_78;
  CLabel local_70;
  CLabel local_50;
  
  this_00 = (CJumpConditionalStatement *)operator_new(0x30);
  local_78._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
       (tuple<const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)
       (labelTrue->label)._M_string_length;
  (labelTrue->label)._M_string_length = 0;
  this_01 = (CConstExpression *)operator_new(0x10);
  CConstExpression::CConstExpression(this_01,0);
  local_88._M_head_impl = (CExpression *)this_01;
  pCVar4 = (CLabelStatement *)operator_new(0x28);
  paVar1 = &local_50.label.field_2;
  pcVar3 = (labelFalse->label)._M_dataplus._M_p;
  local_50.label._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,pcVar3 + (labelFalse->label)._M_string_length);
  CLabelStatement::CLabelStatement(pCVar4,&local_50);
  local_90._M_head_impl = pCVar4;
  pCVar4 = (CLabelStatement *)operator_new(0x28);
  paVar2 = &local_70.label.field_2;
  local_70.label._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,*in_RCX,in_RCX[1] + *in_RCX);
  CLabelStatement::CLabelStatement(pCVar4,&local_70);
  local_80._M_head_impl = pCVar4;
  CJumpConditionalStatement::CJumpConditionalStatement
            (this_00,NOT_EQUALS,
             (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &local_78,
             (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &local_88,
             (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
              *)&local_90,
             (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
              *)&local_80);
  (this->super_ISubtreeWrapper)._vptr_ISubtreeWrapper = (_func_int **)this_00;
  if (local_80._M_head_impl != (CLabelStatement *)0x0) {
    (*((local_80._M_head_impl)->super_CStatement).super_IStatement.super_INode._vptr_INode[2])();
  }
  local_80._M_head_impl = (CLabelStatement *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.label._M_dataplus._M_p != paVar2) {
    operator_delete(local_70.label._M_dataplus._M_p);
  }
  if (local_90._M_head_impl != (CLabelStatement *)0x0) {
    (*((local_90._M_head_impl)->super_CStatement).super_IStatement.super_INode._vptr_INode[2])();
  }
  local_90._M_head_impl = (CLabelStatement *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.label._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.label._M_dataplus._M_p);
  }
  if ((CConstExpression *)local_88._M_head_impl != (CConstExpression *)0x0) {
    (*(((CExpression *)&(local_88._M_head_impl)->super_IExpression)->super_IExpression).super_INode.
      _vptr_INode[2])();
  }
  local_88._M_head_impl = (CExpression *)0x0;
  if (local_78._M_t.
      super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
      .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)0x0)
  {
    (**(code **)((long)*(IExpression *)
                        local_78._M_t.
                        super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                        .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl + 0x10)
    )();
  }
  return (__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const CStatement> CExpressionWrapper::ToConditional( CLabel labelTrue, CLabel labelFalse ) {
        return std::move( std::unique_ptr<const CStatement>(
                new CJumpConditionalStatement(
                        enums::TLogicOperator::NOT_EQUALS,
                        std::move( expression ),
                        std::move( std::unique_ptr<const CExpression>( new CConstExpression( 0 ))),
                        std::move( std::unique_ptr<const CLabelStatement>( new CLabelStatement( labelTrue ))),
                        std::move( std::unique_ptr<const CLabelStatement>( new CLabelStatement( labelFalse )))
                )
        ));
    }